

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O0

LP * fizplex::MPSReader::read_lp(string *mps_file)

{
  Row row;
  byte bVar1;
  bool bVar2;
  __type _Var3;
  runtime_error *prVar4;
  istream *piVar5;
  ulong uVar6;
  size_t sVar7;
  mapped_type mVar8;
  mapped_type *pmVar9;
  long lVar10;
  undefined8 in_RSI;
  LP *in_RDI;
  double val;
  string row_name_1;
  string var_name;
  string row_name;
  string first_word;
  istringstream iss;
  string obj_name;
  index_map vars;
  index_map rows;
  string current_section;
  string line;
  ifstream ifs;
  LP *lp;
  key_type *in_stack_fffffffffffff9b8;
  LP *in_stack_fffffffffffff9c0;
  double in_stack_fffffffffffff9c8;
  LP *in_stack_fffffffffffff9d0;
  string *in_stack_fffffffffffff9d8;
  LP *in_stack_fffffffffffff9e0;
  LP *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  in_stack_fffffffffffffa20;
  LP *in_stack_fffffffffffffa88;
  index_map *in_stack_fffffffffffffa90;
  istringstream *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  string local_550 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_530;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_528;
  string local_520 [32];
  key_type *local_500;
  LP *pLStack_4f8;
  double local_4f0;
  string local_4e8 [32];
  string local_4c8 [32];
  istringstream local_4a8 [384];
  string local_328 [144];
  string local_298 [32];
  string local_278 [39];
  undefined1 local_251;
  string local_250 [48];
  istream local_220 [527];
  byte local_11;
  
  local_11 = 0;
  LP::LP(in_stack_fffffffffffff9f0);
  std::ifstream::ifstream(local_220,in_RSI,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_251 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    std::runtime_error::runtime_error(prVar4,local_250);
    local_251 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_278);
  std::__cxx11::string::string(local_298);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x134597);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x1345a4);
  std::__cxx11::string::string(local_328);
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) {
      local_11 = 1;
      std::__cxx11::string::~string(local_328);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)0x134c76);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)0x134c83);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_278);
      std::ifstream::~ifstream(local_220);
      if ((local_11 & 1) == 0) {
        LP::~LP(in_stack_fffffffffffff9c0);
      }
      return in_RDI;
    }
    std::__cxx11::istringstream::istringstream(local_4a8,local_278,8);
    next_word((istringstream *)in_stack_fffffffffffff9d8);
    bVar2 = is_indicator(in_stack_fffffffffffff9d8);
    if ((bVar2) &&
       (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8), bVar2)) {
      std::__cxx11::string::operator=(local_298,local_4c8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
      if (bVar2) {
        next_word((istringstream *)in_stack_fffffffffffff9d8);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
        if ((bVar2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
          std::__cxx11::string::operator=(local_328,local_4e8);
        }
        else {
          parse_row_type((string *)in_stack_fffffffffffffa20._M_cur);
          row.lower = (double)in_stack_fffffffffffff9d8;
          row._0_8_ = in_stack_fffffffffffff9d0;
          row.upper = (double)in_stack_fffffffffffff9e0;
          in_stack_fffffffffffff9b8 = local_500;
          in_stack_fffffffffffff9c0 = pLStack_4f8;
          in_stack_fffffffffffff9c8 = local_4f0;
          LP::add_row(pLStack_4f8,row);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Row name is empty");
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar7 = LP::row_count((LP *)0x1347ef);
          pmVar9 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                 *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
          *pmVar9 = sVar7 - 1;
        }
        std::__cxx11::string::~string(local_4e8);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
        if (bVar2) {
          parse_and_add_rhs(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                            in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
          if (bVar2) {
            std::__cxx11::string::string(local_520,local_4c8);
            in_stack_fffffffffffffa20._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffff9b8,(key_type *)0x134969);
            local_528._M_cur = in_stack_fffffffffffffa20._M_cur;
            local_530._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)in_stack_fffffffffffff9b8);
            bVar2 = std::__detail::operator==(&local_528,&local_530);
            if (bVar2) {
              LP::add_column(in_stack_fffffffffffff9d0,
                             (ColType)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                             (double)in_stack_fffffffffffff9c0,(double)in_stack_fffffffffffff9b8,
                             6.24538501595003e-318);
              sVar7 = LP::column_count((LP *)0x1349df);
              mVar8 = sVar7 - 1;
              pmVar9 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                     *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
              *pmVar9 = mVar8;
            }
            while( true ) {
              std::__cxx11::istringstream::rdbuf();
              lVar10 = std::streambuf::in_avail();
              if (lVar10 < 1) break;
              next_word((istringstream *)in_stack_fffffffffffff9d8);
              next_word((istringstream *)in_stack_fffffffffffff9d8);
              std::__cxx11::stod((string *)in_stack_fffffffffffff9c0,
                                 (size_t *)in_stack_fffffffffffff9b8);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
              _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
              if (_Var3) {
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
                LP::add_obj_value(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8,
                                  (double)in_stack_fffffffffffff9d0);
              }
              else {
                in_stack_fffffffffffff9e0 =
                     (LP *)std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
                in_stack_fffffffffffff9d0 =
                     (LP *)(in_stack_fffffffffffff9e0->A).cols.
                           super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                in_stack_fffffffffffff9d8 =
                     (string *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                   *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
                LP::add_value(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8,
                              (size_t)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
              }
              std::__cxx11::string::~string(local_550);
            }
            std::__cxx11::string::~string(local_520);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::istringstream::~istringstream(local_4a8);
  } while( true );
}

Assistant:

LP read_lp(std::string mps_file) {
  LP lp;
  std::ifstream ifs(mps_file);
  if (!ifs.is_open())
    throw std::runtime_error("Couldn't open file " + mps_file);
  std::string line, current_section;
  index_map rows, vars;
  std::string obj_name;
  while (std::getline(ifs, line)) {
    std::istringstream iss(line);
    const auto first_word = next_word(iss);
    if (is_indicator(first_word) && current_section != first_word)
      current_section = first_word;
    else { // Data record
      if (current_section == "ROWS") {
        const std::string row_name = next_word(iss);
        if (first_word == "N" && obj_name.empty())
          obj_name = row_name;
        else {
          lp.add_row(parse_row_type(first_word));
          if (!row_name.empty())
            rows[row_name] = lp.row_count() - 1;
          else
            throw std::runtime_error("Row name is empty");
        }
      } else if (current_section == "RHS")
        parse_and_add_rhs(first_word, iss, rows, lp);
      else if (current_section == "COLUMNS") {
        const std::string var_name = first_word;
        if (vars.find(var_name) == vars.end()) {
          lp.add_column(ColType::LowerBound, 0, inf);
          vars[var_name] = lp.column_count() - 1;
        }
        while (iss.rdbuf()->in_avail() > 0) {
          const std::string row_name = next_word(iss);
          const auto val = std::stod(next_word(iss));
          if (row_name == obj_name)
            lp.add_obj_value(vars[var_name], val);
          else
            lp.add_value(rows[row_name], vars[var_name], val);
        }
      }
    }
  }
  return lp;
}